

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O0

void TxToJSON(CTransaction *tx,uint256 hashBlock,UniValue *entry,Chainstate *active_chainstate,
             CTxUndo *txundo,TxVerbosity verbosity)

{
  bool bVar1;
  int iVar2;
  CBlockIndex *pCVar3;
  UniValue *val;
  CTxUndo *in_RCX;
  UniValue *in_RSI;
  CTransaction *in_RDI;
  TxVerbosity in_R8D;
  long in_FS_OFFSET;
  CBlockIndex *pindex;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  CBlockIndex *in_stack_fffffffffffffc48;
  CBlockIndex *in_stack_fffffffffffffc50;
  base_blob<256U> *in_stack_fffffffffffffc58;
  base_blob<256U> *in_stack_fffffffffffffc60;
  BlockManager *in_stack_fffffffffffffc68;
  char *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  UniValue *in_stack_fffffffffffffc80;
  UniValue *in_stack_fffffffffffffc88;
  UniValue *in_stack_fffffffffffffc90;
  UniValue *this;
  undefined4 in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  char *in_stack_fffffffffffffca0;
  bool *in_stack_fffffffffffffca8;
  allocator<char> local_2d9;
  int64_t local_2d8;
  allocator<char> local_2c9;
  UniValue *local_2c8;
  undefined1 local_2b9 [7];
  allocator<char> local_2b2;
  undefined1 local_2b1;
  uint256 local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2b1 = 0 < (int)in_R8D;
  inline_check_non_fatal<bool>
            (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c,
             (char *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88);
  memset(&local_28,0,0x20);
  uint256::uint256((uint256 *)in_stack_fffffffffffffc48);
  TxToUniv(in_RDI,&local_28,in_RSI,true,in_RCX,in_R8D);
  bVar1 = base_blob<256U>::IsNull(in_stack_fffffffffffffc58);
  if (!bVar1) {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffc48);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffc88,
               (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffc80,
               in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
               (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffc68 >> 0x18,0));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
               (char *)in_stack_fffffffffffffc90,(allocator<char> *)in_stack_fffffffffffffc88);
    base_blob<256u>::GetHex_abi_cxx11_(in_stack_fffffffffffffc60);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (in_stack_fffffffffffffc88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc80);
    UniValue::pushKV(in_stack_fffffffffffffc90,(string *)in_stack_fffffffffffffc88,
                     in_stack_fffffffffffffc80);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffffc48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc48);
    std::allocator<char>::~allocator(&local_2b2);
    pCVar3 = node::BlockManager::LookupBlockIndex
                       (in_stack_fffffffffffffc68,(uint256 *)in_stack_fffffffffffffc60);
    if (pCVar3 != (CBlockIndex *)0x0) {
      bVar1 = CChain::Contains((CChain *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                   (char *)in_stack_fffffffffffffc90,(allocator<char> *)in_stack_fffffffffffffc88);
        iVar2 = CChain::Height((CChain *)in_stack_fffffffffffffc48);
        local_2b9._1_4_ = (iVar2 - pCVar3->nHeight) + 1;
        UniValue::UniValue<int,_int,_true>
                  (in_stack_fffffffffffffc88,(int *)in_stack_fffffffffffffc80);
        UniValue::pushKV(in_stack_fffffffffffffc90,(string *)in_stack_fffffffffffffc88,
                         in_stack_fffffffffffffc80);
        UniValue::~UniValue((UniValue *)in_stack_fffffffffffffc48);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc48);
        std::allocator<char>::~allocator((allocator<char> *)(local_2b9 + 6));
        this = (UniValue *)local_2b9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar2,in_stack_fffffffffffffc98),(char *)this,(allocator<char> *)in_RSI)
        ;
        val = (UniValue *)CBlockIndex::GetBlockTime(in_stack_fffffffffffffc48);
        local_2c8 = val;
        UniValue::UniValue<long,_long,_true>(in_RSI,(long *)val);
        UniValue::pushKV(this,(string *)in_RSI,val);
        UniValue::~UniValue((UniValue *)in_stack_fffffffffffffc48);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc48);
        std::allocator<char>::~allocator((allocator<char> *)local_2b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar2,in_stack_fffffffffffffc98),(char *)this,(allocator<char> *)in_RSI)
        ;
        local_2d8 = CBlockIndex::GetBlockTime(in_stack_fffffffffffffc48);
        UniValue::UniValue<long,_long,_true>(in_RSI,(long *)val);
        UniValue::pushKV(this,(string *)in_RSI,val);
        UniValue::~UniValue((UniValue *)in_stack_fffffffffffffc48);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc48);
        std::allocator<char>::~allocator(&local_2c9);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                   (char *)in_stack_fffffffffffffc90,(allocator<char> *)in_stack_fffffffffffffc88);
        UniValue::UniValue<int,_int,_true>
                  (in_stack_fffffffffffffc88,(int *)in_stack_fffffffffffffc80);
        UniValue::pushKV(in_stack_fffffffffffffc90,(string *)in_stack_fffffffffffffc88,
                         in_stack_fffffffffffffc80);
        UniValue::~UniValue((UniValue *)in_stack_fffffffffffffc48);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc48);
        std::allocator<char>::~allocator(&local_2d9);
      }
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffc48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void TxToJSON(const CTransaction& tx, const uint256 hashBlock, UniValue& entry,
                     Chainstate& active_chainstate, const CTxUndo* txundo = nullptr,
                     TxVerbosity verbosity = TxVerbosity::SHOW_DETAILS)
{
    CHECK_NONFATAL(verbosity >= TxVerbosity::SHOW_DETAILS);
    // Call into TxToUniv() in bitcoin-common to decode the transaction hex.
    //
    // Blockchain contextual information (confirmations and blocktime) is not
    // available to code in bitcoin-common, so we query them here and push the
    // data into the returned UniValue.
    TxToUniv(tx, /*block_hash=*/uint256(), entry, /*include_hex=*/true, txundo, verbosity);

    if (!hashBlock.IsNull()) {
        LOCK(cs_main);

        entry.pushKV("blockhash", hashBlock.GetHex());
        const CBlockIndex* pindex = active_chainstate.m_blockman.LookupBlockIndex(hashBlock);
        if (pindex) {
            if (active_chainstate.m_chain.Contains(pindex)) {
                entry.pushKV("confirmations", 1 + active_chainstate.m_chain.Height() - pindex->nHeight);
                entry.pushKV("time", pindex->GetBlockTime());
                entry.pushKV("blocktime", pindex->GetBlockTime());
            }
            else
                entry.pushKV("confirmations", 0);
        }
    }
}